

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

IntegerVersion parseMocVersion(string *str)

{
  IntegerVersion IVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  istream *piVar5;
  undefined1 local_1f8 [8];
  string minor;
  string major;
  istringstream iss;
  size_t pos;
  allocator<char> local_19;
  string *local_18;
  string *str_local;
  IntegerVersion result;
  
  local_18 = str;
  cmQtAutoGen::IntegerVersion::IntegerVersion((IntegerVersion *)&str_local);
  if ((parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,"moc ",&local_19
              );
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_);
  }
  lVar4 = std::__cxx11::string::find((string *)str,0xfc77d8);
  if (lVar4 != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)str,0);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(major.field_2._M_local_buf + 8),(string *)str,_S_in);
    std::__cxx11::string::string((string *)(minor.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_1f8);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(major.field_2._M_local_buf + 8),
                        (string *)(minor.field_2._M_local_buf + 8),'.');
    bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if ((bVar2 & 1) == 0) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(major.field_2._M_local_buf + 8),(string *)local_1f8,'.');
      bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if ((bVar2 & 1) == 0) {
        str_local._0_4_ = std::__cxx11::stoi((string *)((long)&minor.field_2 + 8),(size_t *)0x0,10);
        str_local._4_4_ = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
      }
    }
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)(minor.field_2._M_local_buf + 8));
    std::__cxx11::istringstream::~istringstream((istringstream *)(major.field_2._M_local_buf + 8));
  }
  IVar1.Minor = str_local._4_4_;
  IVar1.Major = (uint)str_local;
  return IVar1;
}

Assistant:

static cmQtAutoGen::IntegerVersion parseMocVersion(std::string str)
{
  cmQtAutoGen::IntegerVersion result;

  static const std::string prelude = "moc ";
  size_t pos = str.find(prelude);
  if (pos == std::string::npos) {
    return result;
  }

  str.erase(0, prelude.size() + pos);
  std::istringstream iss(str);
  std::string major;
  std::string minor;
  if (!std::getline(iss, major, '.') || !std::getline(iss, minor, '.')) {
    return result;
  }

  result.Major = static_cast<unsigned int>(std::stoi(major));
  result.Minor = static_cast<unsigned int>(std::stoi(minor));
  return result;
}